

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  cmValue cVar2;
  allocator<char> local_41;
  string local_40;
  
  GetFullName(&local_40,this,config,RuntimeBinaryArtifact);
  local_41 = (allocator<char>)0x2e;
  cmStrCat<std::__cxx11::string,char>(__return_storage_ptr__,&local_40,(char *)&local_41);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BUNDLE_EXTENSION",&local_41);
  cVar2 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar2.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"app",&local_41);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)cVar2.Value);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  if (level - ContentLevel < 2) {
    bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (level == FullLevel) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "app");
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}